

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O3

void __thiscall DPusher::Tick(DPusher *this)

{
  double *pdVar1;
  uint uVar2;
  msecnode_t *pmVar3;
  undefined1 auVar4 [16];
  DObject *pDVar5;
  bool bVar6;
  int iVar7;
  sector_t *psVar8;
  undefined4 extraout_var;
  AActor *pAVar10;
  DObject *pDVar11;
  AActor *t2;
  sector_t *this_00;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  DVector2 pos;
  FPortalGroupArray check;
  CheckResult cres;
  FMultiBlockThingsIterator it;
  undefined1 local_248 [32];
  DAngle local_228;
  undefined1 local_220 [40];
  CheckResult local_1f8;
  FMultiBlockThingsIterator local_1d0;
  PClass *pPVar9;
  
  if (!var_pushers.Value) {
    return;
  }
  if ((sectors[this->m_Affectee].Flags & 0x20) == 0) {
    return;
  }
  if (this->m_Type != p_push) {
    this_00 = sectors + this->m_Affectee;
    pmVar3 = this_00->touching_thinglist;
    do {
      if (pmVar3 == (msecnode_t *)0x0) {
        return;
      }
      pAVar10 = pmVar3->m_thing;
      if ((((pAVar10->flags2).Value & 2) != 0) && (((pAVar10->flags).Value & 0x1000) == 0)) {
        psVar8 = sector_t::GetHeightSec(this_00);
        iVar7 = pAVar10->Sector->PortalGroup;
        dVar12 = 0.0;
        dVar14 = 0.0;
        if (iVar7 != this_00->PortalGroup) {
          dVar12 = Displacements.data.Array[this_00->PortalGroup * Displacements.size + iVar7].pos.X
          ;
          dVar14 = Displacements.data.Array[this_00->PortalGroup * Displacements.size + iVar7].pos.Y
          ;
        }
        dVar12 = (pAVar10->__Pos).X + dVar12;
        dVar14 = (pAVar10->__Pos).Y + dVar14;
        if (this->m_Type == p_wind) {
          if (psVar8 == (sector_t *)0x0) {
            dVar12 = (pAVar10->__Pos).Z;
            if (pAVar10->floorz <= dVar12 && dVar12 != pAVar10->floorz) goto LAB_0055b9be;
          }
          else {
            dVar12 = (dVar14 * (psVar8->floorplane).normal.Y +
                     (psVar8->floorplane).D + dVar12 * (psVar8->floorplane).normal.X) *
                     (psVar8->floorplane).negiC;
            if (dVar12 < (pAVar10->__Pos).Z) {
LAB_0055b9be:
              dVar13 = (this->m_PushVec).X;
              dVar15 = (this->m_PushVec).Y;
              goto LAB_0055b9d2;
            }
            dVar13 = 0.0;
            dVar15 = 0.0;
            pdVar1 = &pAVar10->player->viewz;
            if (*pdVar1 <= dVar12 && dVar12 != *pdVar1) goto LAB_0055b9d2;
          }
          dVar13 = (this->m_PushVec).X * 0.5;
          dVar15 = (this->m_PushVec).Y * 0.5;
        }
        else {
          if (psVar8 == (sector_t *)0x0) {
            psVar8 = this_00;
          }
          dVar13 = 0.0;
          dVar15 = 0.0;
          if ((pAVar10->__Pos).Z <=
              (dVar14 * (psVar8->floorplane).normal.Y +
              (psVar8->floorplane).D + dVar12 * (psVar8->floorplane).normal.X) *
              (psVar8->floorplane).negiC) goto LAB_0055b9be;
        }
LAB_0055b9d2:
        dVar12 = (pAVar10->Vel).X + dVar13 * 0.0078125;
        dVar14 = (pAVar10->Vel).Y + dVar15 * 0.0078125;
        auVar4._8_4_ = SUB84(dVar14,0);
        auVar4._0_8_ = dVar12;
        auVar4._12_4_ = (int)((ulong)dVar14 >> 0x20);
        (pAVar10->Vel).X = dVar12;
        (pAVar10->Vel).Y = (double)auVar4._8_8_;
      }
      pmVar3 = pmVar3->m_snext;
    } while( true );
  }
  local_220._24_8_ = (AActor **)0x0;
  local_220._32_8_ = 0.0;
  local_220._4_4_ = 0;
  local_220[0x10] = '\0';
  local_220[0] = false;
  pAVar10 = (this->m_Source).field_0.p;
  if (pAVar10 != (AActor *)0x0) {
    if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0055ba35;
    (this->m_Source).field_0.p = (AActor *)0x0;
  }
  pAVar10 = (AActor *)0x0;
LAB_0055ba35:
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&local_1d0,(FPortalGroupArray *)local_220,pAVar10,this->m_Radius,false);
LAB_0055ba5c:
  do {
    bVar6 = FMultiBlockThingsIterator::Next(&local_1d0,&local_1f8);
    pAVar10 = local_1f8.thing;
    if (!bVar6) {
      TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                (&local_1d0.blockIterator.DynHash);
      TArray<unsigned_short,_unsigned_short>::~TArray
                ((TArray<unsigned_short,_unsigned_short> *)(local_220 + 0x18));
      return;
    }
    if ((((local_1f8.thing)->flags2).Value & 2) == 0) goto code_r0x0055ba7e;
    uVar2 = ((local_1f8.thing)->flags).Value;
    if ((compatflags.Value._3_1_ & 1) != 0) {
      if ((uVar2 >> 0xc & 1) != 0) goto LAB_0055baa3;
      goto LAB_0055bab9;
    }
  } while ((uVar2 >> 0xc & 1) != 0);
  goto LAB_0055bacd;
code_r0x0055ba7e:
  if ((compatflags.Value._3_1_ & 1) == 0) goto LAB_0055ba5c;
LAB_0055baa3:
  bVar6 = AActor::IsSentient(local_1f8.thing);
  if ((!bVar6) && (((pAVar10->flags).Value & 4) == 0)) goto LAB_0055ba5c;
LAB_0055bab9:
  if ((pAVar10->player != (player_t *)0x0) && (((pAVar10->flags).Value & 0x200) != 0))
  goto LAB_0055ba5c;
LAB_0055bacd:
  AActor::Vec2To((AActor *)local_248,(this->m_Source).field_0.p);
  dVar12 = c_sqrt((double)local_248._8_8_ * (double)local_248._8_8_ +
                  (double)local_248._0_8_ * (double)local_248._0_8_);
  local_248._24_8_ = (dVar12 * -0.5 + this->m_Magnitude) * 0.00390625;
  if ((double)local_248._24_8_ <= 0.0) goto LAB_0055ba5c;
  t2 = (this->m_Source).field_0.p;
  if (t2 == (AActor *)0x0) {
LAB_0055bb38:
    t2 = (AActor *)0x0;
  }
  else if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->m_Source).field_0.p = (AActor *)0x0;
    goto LAB_0055bb38;
  }
  bVar6 = P_CheckSight(pAVar10,t2,1);
  if (!bVar6) goto LAB_0055ba5c;
  dVar12 = c_atan2((double)local_248._8_8_,(double)local_248._0_8_);
  pDVar11 = (this->m_Source).field_0.o;
  if (pDVar11 != (DObject *)0x0) {
    if ((pDVar11->ObjectFlags & 0x20) == 0) goto LAB_0055bb80;
    (this->m_Source).field_0.p = (AActor *)0x0;
  }
  pDVar11 = (DObject *)0x0;
LAB_0055bb80:
  pPVar9 = pDVar11->Class;
  pDVar5 = (DObject *)(dVar12 * 57.29577951308232);
  if (pPVar9 == (PClass *)0x0) {
    local_248._16_8_ = (DObject *)(dVar12 * 57.29577951308232);
    iVar7 = (**pDVar11->_vptr_DObject)(pDVar11);
    pPVar9 = (PClass *)CONCAT44(extraout_var,iVar7);
    pDVar11->Class = pPVar9;
    pDVar5 = (DObject *)local_248._16_8_;
  }
  local_228.Degrees = (double)((double)pDVar5 + 180.0);
  if ((pPVar9->super_PStruct).super_PNamedType.TypeName.Index != 0x3d) {
    local_228.Degrees = (double)pDVar5;
  }
  AActor::Thrust(pAVar10,&local_228,(double)local_248._24_8_);
  goto LAB_0055ba5c;
}

Assistant:

void DPusher::Tick ()
{
	sector_t *sec;
	AActor *thing;
	msecnode_t *node;
	double ht;

	if (!var_pushers)
		return;

	sec = sectors + m_Affectee;

	// Be sure the special sector type is still turned on. If so, proceed.
	// Else, bail out; the sector type has been changed on us.

	if (!(sec->Flags & SECF_PUSH))
		return;

	// For constant pushers (wind/current) there are 3 situations:
	//
	// 1) Affected Thing is above the floor.
	//
	//    Apply the full force if wind, no force if current.
	//
	// 2) Affected Thing is on the ground.
	//
	//    Apply half force if wind, full force if current.
	//
	// 3) Affected Thing is below the ground (underwater effect).
	//
	//    Apply no force if wind, full force if current.
	//
	// Apply the effect to clipped players only for now.
	//
	// In Phase II, you can apply these effects to Things other than players.
	// [RH] No Phase II, but it works with anything having MF2_WINDTHRUST now.

	if (m_Type == p_push)
	{
		// Seek out all pushable things within the force radius of this
		// point pusher. Crosses sectors, so use blockmap.

		FPortalGroupArray check(FPortalGroupArray::PGA_NoSectorPortals);	// no sector portals because this thing is utterly z-unaware.
		FMultiBlockThingsIterator it(check, m_Source, m_Radius);
		FMultiBlockThingsIterator::CheckResult cres;


		while (it.Next(&cres))
		{
			AActor *thing = cres.thing;
			// Normal ZDoom is based only on the WINDTHRUST flag, with the noclip cheat as an exemption.
			bool pusharound = ((thing->flags2 & MF2_WINDTHRUST) && !(thing->flags & MF_NOCLIP));
					
			// MBF allows any sentient or shootable thing to be affected, but players with a fly cheat aren't.
			if (compatflags & COMPATF_MBFMONSTERMOVE)
			{
				pusharound = ((pusharound || (thing->IsSentient()) || (thing->flags & MF_SHOOTABLE)) // Add categories here
					&& (!(thing->player && (thing->flags & (MF_NOGRAVITY))))); // Exclude flying players here
			}

			if ((pusharound) )
			{
				DVector2 pos = m_Source->Vec2To(thing);
				double dist = pos.Length();
				double speed = (m_Magnitude - (dist/2)) / (PUSH_FACTOR * 2);

				// If speed <= 0, you're outside the effective radius. You also have
				// to be able to see the push/pull source point.

				if ((speed > 0) && (P_CheckSight (thing, m_Source, SF_IGNOREVISIBILITY)))
				{
					DAngle pushangle = pos.Angle();
					if (m_Source->GetClass()->TypeName == NAME_PointPuller) pushangle += 180;  
					thing->Thrust(pushangle, speed);
				}
			}
		}
		return;
	}

	// constant pushers p_wind and p_current

	node = sec->touching_thinglist; // things touching this sector
	for ( ; node ; node = node->m_snext)
	{
		thing = node->m_thing;
		if (!(thing->flags2 & MF2_WINDTHRUST) || (thing->flags & MF_NOCLIP))
			continue;

		sector_t *hsec = sec->GetHeightSec();
		DVector3 pos = thing->PosRelative(sec);
		DVector2 pushvel;
		if (m_Type == p_wind)
		{
			if (hsec == NULL)
			{ // NOT special water sector
				if (thing->Z() > thing->floorz) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else // on ground
				{
					pushvel = m_PushVec / 2; // half force
				}
			}
			else // special water sector
			{
				ht = hsec->floorplane.ZatPoint(pos);
				if (thing->Z() > ht) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else if (thing->player->viewz < ht) // underwater
				{
					pushvel.Zero(); // no force
				}
				else // wading in water
				{
					pushvel = m_PushVec / 2; // full force
				}
			}
		}
		else // p_current
		{
			const secplane_t *floor;

			if (hsec == NULL)
			{ // NOT special water sector
				floor = &sec->floorplane;
			}
			else
			{ // special water sector
				floor = &hsec->floorplane;
			}
			if (thing->Z() > floor->ZatPoint(pos))
			{ // above ground
				pushvel.Zero(); // no force
			}
			else
			{ // on ground/underwater
				pushvel = m_PushVec; // full force
			}
		}
		thing->Vel += pushvel / PUSH_FACTOR;
	}
}